

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# epoll.cpp
# Opt level: O0

void __thiscall
sysapi::epoll_registration::epoll_registration
          (epoll_registration *this,epoll *ep,int fd,uint32_t events,callback_t *callback)

{
  callback_t *callback_local;
  uint32_t events_local;
  int fd_local;
  epoll *ep_local;
  epoll_registration *this_local;
  
  this->ep = ep;
  this->fd = fd;
  this->events = events;
  std::function<void_(unsigned_int)>::function(&this->callback,callback);
  epoll::add(ep,fd,events,this);
  return;
}

Assistant:

epoll_registration::epoll_registration(epoll& ep, int fd, uint32_t events, callback_t callback)
    : ep(&ep)
    , fd(fd)
    , events(events)
    , callback(std::move(callback))
{
    ep.add(fd, events, this);
}